

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void __thiscall
OpenSteer::drawCameraLookAt(OpenSteer *this,Vec3 *cameraPosition,Vec3 *pointToLookAt,Vec3 *up_)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  float fVar22;
  
  fVar14 = cameraPosition->z - *(float *)(this + 8);
  uVar1 = cameraPosition->x;
  uVar5 = cameraPosition->y;
  fVar16 = (float)uVar1 - (float)*(undefined8 *)this;
  fVar17 = (float)uVar5 - (float)((ulong)*(undefined8 *)this >> 0x20);
  uVar2 = pointToLookAt->x;
  uVar6 = pointToLookAt->y;
  fVar15 = fVar14 * pointToLookAt->z + fVar16 * (float)uVar2 + fVar17 * (float)uVar6;
  iVar12 = -(uint)(Vec3::zero.x == fVar16 - fVar15 * (float)uVar2);
  iVar13 = -(uint)(Vec3::zero.y == fVar17 - fVar15 * (float)uVar6);
  auVar18._4_4_ = iVar13;
  auVar18._0_4_ = iVar12;
  auVar18._8_4_ = iVar13;
  auVar18._12_4_ = iVar13;
  auVar21._8_8_ = auVar18._8_8_;
  auVar21._4_4_ = iVar12;
  auVar21._0_4_ = iVar12;
  uVar11 = movmskpd((int)up_,auVar21);
  if (((uVar11 & 1) != 0) && ((byte)((byte)uVar11 >> 1) != 0)) {
    fVar14 = fVar14 - pointToLookAt->z * fVar15;
    if ((fVar14 == Vec3::zero.z) && (!NAN(fVar14) && !NAN(Vec3::zero.z))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"OpenSteer - LookAt: degenerate camera",0x25);
    }
  }
  (*glad_glLoadIdentity)();
  uVar3 = cameraPosition->x;
  uVar7 = cameraPosition->y;
  auVar19._0_4_ = (float)uVar3 - (float)*(undefined8 *)this;
  auVar19._4_4_ = (float)uVar7 - (float)((ulong)*(undefined8 *)this >> 0x20);
  auVar19._8_8_ = 0;
  fVar15 = cameraPosition->z - *(float *)(this + 8);
  fVar14 = fVar15 * fVar15 + auVar19._0_4_ * auVar19._0_4_ + auVar19._4_4_ * auVar19._4_4_;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  if (0.0 < fVar14) {
    auVar9._4_4_ = fVar14;
    auVar9._0_4_ = fVar14;
    auVar9._8_4_ = fVar14;
    auVar9._12_4_ = fVar14;
    auVar19 = divps(auVar19,auVar9);
  }
  fVar17 = (float)(~-(uint)(0.0 < fVar14) & (uint)fVar15 |
                  (uint)(fVar15 / fVar14) & -(uint)(0.0 < fVar14));
  fVar15 = auVar19._0_4_;
  fVar16 = auVar19._4_4_;
  uVar4 = pointToLookAt->y;
  uVar8 = pointToLookAt->z;
  fVar14 = (float)uVar8 * fVar16 - (float)uVar4 * fVar17;
  fVar22 = pointToLookAt->x * fVar17 - (float)uVar8 * fVar15;
  auVar20._0_8_ = CONCAT44(fVar22,fVar14);
  auVar20._8_4_ = (float)uVar8 * auVar19._8_4_ - auVar19._8_4_ * 0.0;
  auVar20._12_4_ = (float)uVar8 * auVar19._12_4_ - auVar19._12_4_ * 0.0;
  fVar23 = (float)uVar4 * fVar15 - pointToLookAt->x * fVar16;
  fVar14 = fVar23 * fVar23 + fVar14 * fVar14 + fVar22 * fVar22;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  local_30 = -fVar17;
  local_50 = -fVar15;
  if (0.0 < fVar14) {
    auVar10._4_4_ = fVar14;
    auVar10._0_4_ = fVar14;
    auVar10._8_4_ = fVar14;
    auVar10._12_4_ = fVar14;
    auVar21 = divps(auVar20,auVar10);
    auVar20._0_8_ = auVar21._0_8_;
  }
  local_38 = (float)(~-(uint)(0.0 < fVar14) & (uint)fVar23 |
                    (uint)(fVar23 / fVar14) & -(uint)(0.0 < fVar14));
  local_58 = (float)auVar20._0_8_;
  local_48 = (float)((ulong)auVar20._0_8_ >> 0x20);
  local_54 = local_48 * fVar17 - fVar16 * local_38;
  local_44 = local_38 * fVar15 - fVar17 * local_58;
  local_34 = local_58 * fVar16 - local_48 * fVar15;
  local_2c = 0;
  uStack_24 = 0;
  local_3c = 0;
  local_4c = 0;
  local_1c = 0x3f800000;
  local_40 = -fVar16;
  (*glad_glLoadMatrixf)(&local_58);
  (*glad_glTranslatef)(-*(GLfloat *)this,-*(GLfloat *)(this + 4),-*(GLfloat *)(this + 8));
  return;
}

Assistant:

void 
OpenSteer::drawCameraLookAt (const Vec3& cameraPosition,
                             const Vec3& pointToLookAt,
                             const Vec3& up_)
{
    // check for valid "look at" parameters
    drawCameraLookAtCheck (cameraPosition, pointToLookAt, up_);

    glLoadIdentity();
    float matrix2[16];

    Vec3 forward = pointToLookAt - cameraPosition;
    forward = forward.normalize();
    Vec3 side;
    side.cross(forward, up_);
    side = side.normalize();
    Vec3 up;
    up.cross(side, forward);

    matrix2[0] = side.x;
    matrix2[4] = side.y;
    matrix2[8] = side.z;
    matrix2[12] = 0.f;
    matrix2[1] = up.x;
    matrix2[5] = up.y;
    matrix2[9] = up.z;
    matrix2[13] = 0.f;
    matrix2[2] = -forward.x;
    matrix2[6] = -forward.y;
    matrix2[10] = -forward.z;
    matrix2[14] = 0.f;
    matrix2[3] = matrix2[7] = matrix2[11] = 0.f;
    matrix2[15] = 1.f;

    glLoadMatrixf(matrix2);
    glTranslatef(-cameraPosition.x, -cameraPosition.y, -cameraPosition.z);
}